

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

ExprList * exprListAppendList(Parse *pParse,ExprList *pList,ExprList *pAppend)

{
  Expr *pEVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (pAppend != (ExprList *)0x0) {
    if (pList == (ExprList *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar3 = (long)pList->nExpr;
    }
    if (0 < pAppend->nExpr) {
      lVar4 = 0x20;
      lVar2 = 0;
      do {
        pEVar1 = *(Expr **)((long)(pAppend->a + -1) + lVar4);
        if (pEVar1 == (Expr *)0x0) {
          pEVar1 = (Expr *)0x0;
        }
        else {
          pEVar1 = exprDup(pParse->db,pEVar1,0,(u8 **)0x0);
        }
        pList = sqlite3ExprListAppend((Parse *)pParse->db,pList,pEVar1);
        if (pList != (ExprList *)0x0) {
          *(undefined1 *)((long)pList->a + lVar4 + lVar3 * 0x20 + -8) =
               *(undefined1 *)((long)pAppend->a + lVar4 + -8);
        }
        lVar2 = lVar2 + 1;
        lVar4 = lVar4 + 0x20;
      } while (lVar2 < pAppend->nExpr);
    }
  }
  return pList;
}

Assistant:

static ExprList *exprListAppendList(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  ExprList *pAppend       /* List of values to append. Might be NULL */
){
  if( pAppend ){
    int i;
    int nInit = pList ? pList->nExpr : 0;
    for(i=0; i<pAppend->nExpr; i++){
      Expr *pDup = sqlite3ExprDup(pParse->db, pAppend->a[i].pExpr, 0);
      pList = sqlite3ExprListAppend(pParse, pList, pDup);
      if( pList ) pList->a[nInit+i].sortOrder = pAppend->a[i].sortOrder;
    }
  }
  return pList;
}